

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

int Cba_ObjRight(Cba_Ntk_t *p,int i)

{
  int iVar1;
  int i_local;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_ObjFon0(p,i);
  iVar1 = Cba_FonRight(p,iVar1);
  return iVar1;
}

Assistant:

static inline int            Cba_ObjRight( Cba_Ntk_t * p, int i )            { return Cba_FonRight( p, Cba_ObjFon0(p, i) );                                                }